

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O1

uLong crc32_combine_(uLong crc1,uLong crc2,long len2)

{
  bool bVar1;
  int n_3;
  int n;
  long lVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long even [32];
  ulong local_218 [32];
  ulong local_118 [33];
  
  if (0 < len2) {
    local_218[0] = 0xedb88320;
    lVar2 = 1;
    uVar4 = 1;
    do {
      local_218[lVar2] = uVar4;
      uVar4 = uVar4 * 2;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    do {
      uVar4 = local_218[lVar2];
      uVar5 = 0;
      puVar3 = local_218;
      if (uVar4 != 0) {
        do {
          if ((uVar4 & 1) != 0) {
            uVar5 = uVar5 ^ *puVar3;
          }
          bVar1 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
          puVar3 = puVar3 + 1;
        } while (bVar1);
      }
      local_118[lVar2] = uVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    do {
      uVar4 = local_118[lVar2];
      uVar5 = 0;
      puVar3 = local_118;
      if (uVar4 != 0) {
        do {
          if ((uVar4 & 1) != 0) {
            uVar5 = uVar5 ^ *puVar3;
          }
          bVar1 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
          puVar3 = puVar3 + 1;
        } while (bVar1);
      }
      local_218[lVar2] = uVar5;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    do {
      lVar2 = 0;
      do {
        uVar4 = local_218[lVar2];
        uVar5 = 0;
        puVar3 = local_218;
        if (uVar4 != 0) {
          do {
            if ((uVar4 & 1) != 0) {
              uVar5 = uVar5 ^ *puVar3;
            }
            bVar1 = 1 < uVar4;
            uVar4 = uVar4 >> 1;
            puVar3 = puVar3 + 1;
          } while (bVar1);
        }
        local_118[lVar2] = uVar5;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
      uVar4 = crc1;
      if (((len2 & 1U) != 0) && (uVar4 = 0, puVar3 = local_118, crc1 != 0)) {
        do {
          if ((crc1 & 1) != 0) {
            uVar4 = uVar4 ^ *puVar3;
          }
          bVar1 = 1 < crc1;
          crc1 = crc1 >> 1;
          puVar3 = puVar3 + 1;
        } while (bVar1);
      }
      crc1 = uVar4;
      if ((ulong)len2 < 2) break;
      lVar2 = 0;
      do {
        uVar5 = local_118[lVar2];
        uVar6 = 0;
        puVar3 = local_118;
        if (uVar5 != 0) {
          do {
            if ((uVar5 & 1) != 0) {
              uVar6 = uVar6 ^ *puVar3;
            }
            bVar1 = 1 < uVar5;
            puVar3 = puVar3 + 1;
            uVar5 = uVar5 >> 1;
          } while (bVar1);
        }
        local_218[lVar2] = uVar6;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
      if (((len2 & 2U) != 0) && (crc1 = 0, puVar3 = local_218, uVar4 != 0)) {
        do {
          if ((uVar4 & 1) != 0) {
            crc1 = crc1 ^ *puVar3;
          }
          bVar1 = 1 < uVar4;
          uVar4 = uVar4 >> 1;
          puVar3 = puVar3 + 1;
        } while (bVar1);
      }
      bVar1 = 3 < (ulong)len2;
      len2 = (ulong)len2 >> 2;
    } while (bVar1);
    crc1 = crc1 ^ crc2;
  }
  return crc1;
}

Assistant:

local uLong crc32_combine_(uLong crc1, uLong crc2, z_off64_t len2)
{
    int n;
    unsigned long row;
    unsigned long even[GF2_DIM];    /* even-power-of-two zeros operator */
    unsigned long odd[GF2_DIM];     /* odd-power-of-two zeros operator */

    /* degenerate case (also disallow negative lengths) */
    if (len2 <= 0)
        return crc1;

    /* put operator for one zero bit in odd */
    odd[0] = 0xedb88320UL;          /* CRC-32 polynomial */
    row = 1;
    for (n = 1; n < GF2_DIM; n++) {
        odd[n] = row;
        row <<= 1;
    }

    /* put operator for two zero bits in even */
    gf2_matrix_square(even, odd);

    /* put operator for four zero bits in odd */
    gf2_matrix_square(odd, even);

    /* apply len2 zeros to crc1 (first square will put the operator for one
       zero byte, eight zero bits, in even) */
    do {
        /* apply zeros operator for this bit of len2 */
        gf2_matrix_square(even, odd);
        if (len2 & 1)
            crc1 = gf2_matrix_times(even, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
        if (len2 == 0)
            break;

        /* another iteration of the loop with odd and even swapped */
        gf2_matrix_square(odd, even);
        if (len2 & 1)
            crc1 = gf2_matrix_times(odd, crc1);
        len2 >>= 1;

        /* if no more bits set, then done */
    } while (len2 != 0);

    /* return combined crc */
    crc1 ^= crc2;
    return crc1;
}